

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

void capnp::_::initDynamicTestLists(Builder builder)

{
  Type TVar1;
  Reader *pRVar2;
  long lVar3;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  initializer_list<capnp::DynamicValue::Reader> value;
  initializer_list<capnp::DynamicValue::Reader> value_00;
  initializer_list<capnp::DynamicValue::Reader> value_01;
  initializer_list<capnp::DynamicValue::Reader> value_02;
  initializer_list<capnp::DynamicValue::Reader> value_03;
  initializer_list<capnp::DynamicValue::Reader> value_04;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  BuilderFor<capnp::DynamicList> l_2;
  BuilderFor<capnp::DynamicList> l;
  BuilderFor<DynamicList> local_398;
  BuilderFor<DynamicStruct> local_360;
  undefined1 local_330 [8];
  anon_union_64_12_1c583c3a_for_Reader_1 local_328;
  undefined1 local_2e8 [8];
  anon_union_64_12_1c583c3a_for_Reader_1 local_2e0;
  Type local_2a0;
  undefined8 local_298;
  BuilderFor<capnp::DynamicStruct> lists;
  Schema local_228;
  SegmentBuilder *pSStack_220;
  CapTableBuilder *local_218;
  void *pvStack_210;
  WirePointer *local_208;
  StructDataBitCount SStack_200;
  StructPointerCount SStack_1fc;
  undefined2 uStack_1fa;
  Builder local_1f0;
  Builder local_1b0;
  Builder local_170;
  Builder local_130;
  Builder local_f0;
  Builder local_b0;
  Builder local_70;
  
  local_208 = builder.builder.pointers;
  SStack_200 = builder.builder.dataSize;
  SStack_1fc = builder.builder.pointerCount;
  uStack_1fa = builder.builder._38_2_;
  local_218 = builder.builder.capTable;
  pvStack_210 = builder.builder.data;
  local_228 = builder.schema.super_Schema.raw;
  pSStack_220 = builder.builder.segment;
  DynamicStruct::Builder::init((Builder *)local_330,(EVP_PKEY_CTX *)&local_228);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&lists,(Builder *)local_330);
  DynamicValue::Builder::~Builder((Builder *)local_330);
  DynamicStruct::Builder::init((Builder *)&local_70,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::~Builder(&local_70);
  DynamicStruct::Builder::init((Builder *)&local_b0,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::~Builder(&local_b0);
  DynamicStruct::Builder::init((Builder *)&local_f0,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::~Builder(&local_f0);
  DynamicStruct::Builder::init((Builder *)&local_130,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::~Builder(&local_130);
  DynamicStruct::Builder::init((Builder *)&local_170,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::~Builder(&local_170);
  DynamicStruct::Builder::init((Builder *)&local_1b0,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::~Builder(&local_1b0);
  DynamicStruct::Builder::init((Builder *)&local_1f0,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::~Builder(&local_1f0);
  name_15.content.size_ = 6;
  name_15.content.ptr = "list0";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_15);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = VOID;
  name.content.size_ = 2;
  name.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_16.content.size_ = 6;
  name_16.content.ptr = "list0";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_16);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = VOID;
  name_00.content.size_ = 2;
  name_00.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_00,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_17.content.size_ = 6;
  name_17.content.ptr = "list1";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_17);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = BOOL;
  local_328.boolValue = true;
  name_01.content.size_ = 2;
  name_01.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_01,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_18.content.size_ = 6;
  name_18.content.ptr = "list1";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_18);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = BOOL;
  local_328.boolValue = false;
  name_02.content.size_ = 2;
  name_02.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_02,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_19.content.size_ = 6;
  name_19.content.ptr = "list1";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_19);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,2);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = BOOL;
  local_328.boolValue = true;
  name_03.content.size_ = 2;
  name_03.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_03,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_20.content.size_ = 6;
  name_20.content.ptr = "list1";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_20);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,3);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = BOOL;
  local_328.boolValue = (bool)1;
  name_04.content.size_ = 2;
  name_04.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_04,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_21.content.size_ = 6;
  name_21.content.ptr = "list8";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_21);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = UINT;
  local_328.intValue = 0x7b;
  name_05.content.size_ = 2;
  name_05.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_05,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_22.content.size_ = 6;
  name_22.content.ptr = "list8";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_22);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = UINT;
  local_328.intValue = 0x2d;
  name_06.content.size_ = 2;
  name_06.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_06,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_23.content.size_ = 7;
  name_23.content.ptr = "list16";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_23);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = UINT;
  local_328.floatValue = 6.09924039791019e-320;
  name_07.content.size_ = 2;
  name_07.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_07,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_24.content.size_ = 7;
  name_24.content.ptr = "list16";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_24);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = UINT;
  local_328.floatValue = 3.35421166961622e-320;
  name_08.content.size_ = 2;
  name_08.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_08,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_25.content.size_ = 7;
  name_25.content.ptr = "list32";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_25);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = UINT;
  local_328.floatValue = 6.09957581907715e-316;
  name_09.content.size_ = 2;
  name_09.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_09,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_26.content.size_ = 7;
  name_26.content.ptr = "list32";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_26);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = UINT;
  local_328.floatValue = 1.15891936066468e-315;
  name_10.content.size_ = 2;
  name_10.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_10,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_27.content.size_ = 7;
  name_27.content.ptr = "list64";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_27);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = UINT;
  local_328.floatValue = 6.099575819687104e-309;
  name_11.content.size_ = 2;
  name_11.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_11,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_28.content.size_ = 7;
  name_28.content.ptr = "list64";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_28);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = UINT;
  local_328.floatValue = 1.158919361274642e-308;
  name_12.content.size_ = 2;
  name_12.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_12,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_29.content.size_ = 6;
  name_29.content.ptr = "listP";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_29);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = TEXT;
  local_328.floatValue = 2.14139562637144e-317;
  local_328.textValue.super_StringPtr.content.size_ = 4;
  name_13.content.size_ = 2;
  name_13.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_13,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  name_30.content.size_ = 6;
  name_30.content.ptr = "listP";
  DynamicStruct::Builder::get((Builder *)&l,&lists,name_30);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_398,(Builder *)&l)
  ;
  DynamicList::Builder::operator[]((Builder *)&l_2,&local_398,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_360,(Builder *)&l_2);
  local_330._0_4_ = TEXT;
  local_328.floatValue = (double)((long)"foo\n\r\t\vbar" + 7);
  local_328.textValue.super_StringPtr.content.size_ = 4;
  name_14.content.size_ = 2;
  name_14.content.ptr = "f";
  DynamicStruct::Builder::set(&local_360,name_14,(Reader *)local_330);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicStruct::Builder::init((Builder *)local_330,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&l,(Builder *)local_330);
  DynamicValue::Builder::~Builder((Builder *)local_330);
  DynamicList::Builder::init(&l_2,(EVP_PKEY_CTX *)&l);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_398,(Builder *)&l_2);
  TVar1 = INT;
  local_328.intValue = 1;
  local_2e0.intValue = 2;
  local_298 = 3;
  value._M_len = 3;
  value._M_array = (iterator)local_330;
  local_330._0_4_ = TVar1;
  local_2e8._0_4_ = TVar1;
  local_2a0 = TVar1;
  DynamicList::Builder::copyFrom(&local_398,value);
  lVar3 = 0x90;
  do {
    DynamicValue::Reader::~Reader((Reader *)(local_330 + lVar3));
    lVar3 = lVar3 + -0x48;
  } while (lVar3 != -0x48);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicList::Builder::init(&l_2,(EVP_PKEY_CTX *)&l);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_398,(Builder *)&l_2);
  local_328.intValue = 4;
  local_2e0.intValue = 5;
  value_00._M_len = 2;
  value_00._M_array = (iterator)local_330;
  local_330._0_4_ = TVar1;
  local_2e8._0_4_ = TVar1;
  DynamicList::Builder::copyFrom(&local_398,value_00);
  pRVar2 = (Reader *)local_2e8;
  lVar3 = 0;
  do {
    DynamicValue::Reader::~Reader(pRVar2);
    lVar3 = lVar3 + 0x48;
    pRVar2 = pRVar2 + -1;
  } while (lVar3 != 0x90);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicList::Builder::init(&l_2,(EVP_PKEY_CTX *)&l);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_398,(Builder *)&l_2);
  local_330._0_4_ = INT;
  local_328.floatValue = 6.09737974668795e-317;
  value_01._M_len = 1;
  value_01._M_array = (iterator)local_330;
  DynamicList::Builder::copyFrom(&local_398,value_01);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicStruct::Builder::init((Builder *)local_330,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&l,(Builder *)local_330);
  DynamicValue::Builder::~Builder((Builder *)local_330);
  DynamicList::Builder::init(&l_2,(EVP_PKEY_CTX *)&l);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_398,(Builder *)&l_2);
  TVar1 = TEXT;
  local_328.floatValue = 2.14139562637144e-317;
  local_328.textValue.super_StringPtr.content.size_ = 4;
  local_2e0.floatValue = (double)((long)"foo\n\r\t\vbar" + 7);
  local_2e0.textValue.super_StringPtr.content.size_ = 4;
  value_02._M_len = 2;
  value_02._M_array = (iterator)local_330;
  local_330._0_4_ = TVar1;
  local_2e8._0_4_ = TVar1;
  DynamicList::Builder::copyFrom(&local_398,value_02);
  pRVar2 = (Reader *)local_2e8;
  lVar3 = 0;
  do {
    DynamicValue::Reader::~Reader(pRVar2);
    lVar3 = lVar3 + 0x48;
    pRVar2 = pRVar2 + -1;
  } while (lVar3 != 0x90);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicList::Builder::init(&l_2,(EVP_PKEY_CTX *)&l);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_398,(Builder *)&l_2);
  local_330._0_4_ = TEXT;
  local_328.floatValue = (double)((long)"foo\n\tbaz" + 5);
  local_328.textValue.super_StringPtr.content.size_ = 4;
  value_03._M_len = 1;
  value_03._M_array = (iterator)local_330;
  DynamicList::Builder::copyFrom(&local_398,value_03);
  DynamicValue::Reader::~Reader((Reader *)local_330);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicList::Builder::init(&l_2,(EVP_PKEY_CTX *)&l);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_398,(Builder *)&l_2);
  local_328.floatValue = (double)((long)"[foo, (bar, baz)] qux" + 0x12);
  local_328.textValue.super_StringPtr.content.size_ = 4;
  local_2e0.floatValue = 2.16513646878541e-317;
  local_2e0.textValue.super_StringPtr.content.size_ = 6;
  value_04._M_len = 2;
  value_04._M_array = (iterator)local_330;
  local_330._0_4_ = TVar1;
  local_2e8._0_4_ = TVar1;
  DynamicList::Builder::copyFrom(&local_398,value_04);
  pRVar2 = (Reader *)local_2e8;
  lVar3 = 0;
  do {
    DynamicValue::Reader::~Reader(pRVar2);
    lVar3 = lVar3 + 0x48;
    pRVar2 = pRVar2 + -1;
  } while (lVar3 != 0x90);
  DynamicValue::Builder::~Builder((Builder *)&l_2);
  DynamicStruct::Builder::init((Builder *)local_330,(EVP_PKEY_CTX *)&lists);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&l_2,(Builder *)local_330);
  DynamicValue::Builder::~Builder((Builder *)local_330);
  DynamicList::Builder::init((Builder *)local_330,(EVP_PKEY_CTX *)&l_2);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&l,(Builder *)local_330);
  DynamicValue::Builder::~Builder((Builder *)local_330);
  DynamicList::Builder::operator[]((Builder *)local_330,&l,0);
  DynamicValue::Builder::AsImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            ((Builder *)&local_398,(Builder *)local_330);
  *(undefined4 *)((long)&((local_398.builder.segment)->super_SegmentReader).arena + 4) = 0x7b;
  DynamicValue::Builder::~Builder((Builder *)local_330);
  DynamicList::Builder::operator[]((Builder *)local_330,&l,1);
  DynamicValue::Builder::AsImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            ((Builder *)&local_398,(Builder *)local_330);
  *(undefined4 *)((long)&((local_398.builder.segment)->super_SegmentReader).arena + 4) = 0x1c8;
  DynamicValue::Builder::~Builder((Builder *)local_330);
  DynamicList::Builder::init((Builder *)local_330,(EVP_PKEY_CTX *)&l_2);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_398,(Builder *)local_330);
  l.builder.structDataSize = local_398.builder.structDataSize;
  l.builder.structPointerCount = local_398.builder.structPointerCount;
  l.builder.elementSize = local_398.builder.elementSize;
  l.builder._39_1_ = local_398.builder._39_1_;
  l.builder.ptr = local_398.builder.ptr;
  l.builder.elementCount = local_398.builder.elementCount;
  l.builder.step = local_398.builder.step;
  l.builder.segment = local_398.builder.segment;
  l.builder.capTable = local_398.builder.capTable;
  l.schema.elementType.baseType = local_398.schema.elementType.baseType;
  l.schema.elementType.listDepth = local_398.schema.elementType.listDepth;
  l.schema.elementType.isImplicitParam = local_398.schema.elementType.isImplicitParam;
  l.schema.elementType.field_3 = local_398.schema.elementType.field_3;
  l.schema.elementType._6_2_ = local_398.schema.elementType._6_2_;
  l.schema.elementType.field_4 = local_398.schema.elementType.field_4;
  DynamicValue::Builder::~Builder((Builder *)local_330);
  DynamicList::Builder::operator[]((Builder *)local_330,&l,0);
  DynamicValue::Builder::AsImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            ((Builder *)&local_398,(Builder *)local_330);
  *(undefined4 *)((long)&((local_398.builder.segment)->super_SegmentReader).arena + 4) = 0x315;
  DynamicValue::Builder::~Builder((Builder *)local_330);
  return;
}

Assistant:

void initDynamicTestLists(DynamicStruct::Builder builder) {
  dynamicInitListDefaults(builder);
}